

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuconnection_p.cpp
# Opt level: O0

void QDBusMenuConnection::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QDBusError *in_RCX;
  int in_EDX;
  int in_ESI;
  QDBusMenuConnection *_t;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      trayIconRegistered((QDBusMenuConnection *)0xaf2dbe);
    }
    else if (in_EDX == 1) {
      dbusError((QDBusMenuConnection *)0x1,in_RCX);
    }
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QDBusMenuConnection::*)()>
              ((QtMocHelpers *)in_RCX,(void **)trayIconRegistered,0,0);
  }
  return;
}

Assistant:

void QDBusMenuConnection::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuConnection *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->trayIconRegistered(); break;
        case 1: _t->dbusError((*reinterpret_cast< std::add_pointer_t<QDBusError>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuConnection::*)()>(_a, &QDBusMenuConnection::trayIconRegistered, 0))
            return;
    }
}